

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

Builder * __thiscall arangodb::velocypack::Builder::operator=(Builder *this,Builder *that)

{
  Buffer<unsigned_char> *pBVar1;
  Builder *pBVar2;
  uchar *puVar3;
  
  if (this != that) {
    if ((that->_buffer).
        super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      std::__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
      reset((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *
            )this);
      pBVar2 = (Builder *)&that->_bufferPtr;
    }
    else {
      std::
      make_shared<arangodb::velocypack::Buffer<unsigned_char>,arangodb::velocypack::Buffer<unsigned_char>&>
                ((Buffer<unsigned_char> *)&stack0xffffffffffffffd8);
      std::__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
      operator=((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                 *)this,(__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         *)&stack0xffffffffffffffd8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
      pBVar2 = this;
    }
    pBVar1 = (pBVar2->_buffer).
             super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this->_bufferPtr = pBVar1;
    if (pBVar1 == (Buffer<unsigned_char> *)0x0) {
      puVar3 = (uchar *)0x0;
    }
    else {
      puVar3 = pBVar1->_buffer;
    }
    this->_start = puVar3;
    this->_pos = that->_pos;
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::operator=(&this->_stack,&that->_stack);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_indexes,&that->_indexes);
    this->_keyWritten = that->_keyWritten;
    this->options = that->options;
  }
  return this;
}

Assistant:

Builder& Builder::operator=(Builder const& that) {
  if (this != &that) {
    if (that._buffer == nullptr) {
      _buffer.reset();
      _bufferPtr = that._bufferPtr;
    } else {
      _buffer = std::make_shared<Buffer<uint8_t>>(*that._buffer);
      _bufferPtr = _buffer.get();
    }
    if (_bufferPtr == nullptr) {
      _start = nullptr;
    } else {
      _start = _bufferPtr->data();
    }
    _pos = that._pos;
    _stack = that._stack;
    _indexes = that._indexes;
    _keyWritten = that._keyWritten;
    options = that.options;
  }
  VELOCYPACK_ASSERT(options != nullptr);
  return *this;
}